

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O2

void __thiscall nesvis::MemoryWidget::draw(MemoryWidget *this)

{
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  ImGui::Begin("Memory viewer",(bool *)0x0,0);
  ImGui::BeginTabBar("##tabs",0);
  bVar1 = ImGui::BeginTabItem("Cpu",(bool *)0x0,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Cpu",&local_49);
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:32:21)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:32:21)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    draw_tab(this,&local_48,&this->cpu_mem_labels_,0xffff,
             (function<unsigned_char_(unsigned_short)> *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    ImGui::EndTabItem();
  }
  bVar1 = ImGui::BeginTabItem("Ppu",(bool *)0x0,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Ppu",&local_49);
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:41:21)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/application/src/memory_widget.h:41:21)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    draw_tab(this,&local_48,&this->ppu_mem_lables_,0x4000,
             (function<unsigned_char_(unsigned_short)> *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    ImGui::EndTabItem();
  }
  ImGui::EndTabBar();
  ImGui::End();
  return;
}

Assistant:

void draw() {
        ImGui::Begin("Memory viewer", nullptr);

        ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None);

        if (ImGui::BeginTabItem("Cpu")) {
            draw_tab("Cpu",
                    cpu_mem_labels_,
                    0xFFFF,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }
        if (ImGui::BeginTabItem("Ppu")) {
            draw_tab("Ppu",
                    ppu_mem_lables_,
                    0x4000,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->ppu_mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
        ImGui::End();
    }